

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

void __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::~FreeList
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  ulong uVar1;
  pointer ppQVar2;
  
  this->_vptr_FreeList = (_func_int **)&PTR__FreeList_00172b18;
  this->li_ = 0;
  ppQVar2 = (this->freeList).
            super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->freeList).
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppQVar2) {
    uVar1 = 0;
    do {
      if (ppQVar2[uVar1] != (QueueElement *)0x0) {
        operator_delete__(ppQVar2[uVar1]);
      }
      uVar1 = this->li_ + 1;
      this->li_ = uVar1;
      ppQVar2 = (this->freeList).
                super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar1 < (ulong)((long)(this->freeList).
                                   super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar2 >> 3))
    ;
  }
  if (ppQVar2 != (pointer)0x0) {
    operator_delete(ppQVar2);
    return;
  }
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }